

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswConstr.c
# Opt level: O1

int Ssw_ManSweepConstr(Ssw_Man_t *p)

{
  void **ppvVar1;
  void *pvVar2;
  Vec_Int_t *pVVar3;
  bool bVar4;
  int iVar5;
  Aig_Man_t *pAVar6;
  Aig_Obj_t *pAVar7;
  Bar_Progress_t *p_00;
  Vec_Ptr_t *pVVar8;
  long lVar9;
  long lVar10;
  Aig_Obj_t *p1;
  uint uVar11;
  Aig_Obj_t *pAVar12;
  ulong uVar13;
  int f;
  long lVar14;
  timespec ts;
  timespec local_40;
  
  iVar5 = clock_gettime(3,&local_40);
  if (iVar5 < 0) {
    lVar9 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  pAVar6 = Ssw_FramesWithClasses(p);
  p->pFrames = pAVar6;
  uVar11 = pAVar6->nObjs[3] - p->pAig->nRegs;
  if ((uVar11 & 1) != 0) {
    __assert_fail("(nConstrPairs & 1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswConstr.c"
                  ,0x279,"int Ssw_ManSweepConstr(Ssw_Man_t *)");
  }
  if (0 < (int)uVar11) {
    lVar14 = 0;
    do {
      pVVar8 = p->pFrames->vCos;
      lVar10 = (long)pVVar8->nSize;
      if ((lVar10 <= lVar14) || (lVar10 <= lVar14 + 1)) goto LAB_005e18da;
      ppvVar1 = pVVar8->pArray;
      Ssw_NodesAreConstrained
                (p,*(Aig_Obj_t **)((long)ppvVar1[lVar14] + 8),
                 *(Aig_Obj_t **)((long)ppvVar1[lVar14 + 1] + 8));
      lVar14 = lVar14 + 2;
    } while ((int)lVar14 < (int)uVar11);
  }
  pAVar6 = p->pAig;
  if (0 < pAVar6->nRegs) {
    uVar13 = (ulong)uVar11;
    lVar14 = 0;
    do {
      if (((int)uVar13 < 0) ||
         (pVVar8 = p->pFrames->vCos, pVVar8->nSize <= (int)(uVar11 + (int)lVar14)))
      goto LAB_005e18da;
      Ssw_CnfNodeAddToSolver
                (p->pMSat,(Aig_Obj_t *)
                          (*(ulong *)((long)pVVar8->pArray[uVar13] + 8) & 0xfffffffffffffffe));
      lVar14 = lVar14 + 1;
      pAVar6 = p->pAig;
      uVar13 = uVar13 + 1;
    } while (lVar14 < pAVar6->nRegs);
  }
  iVar5 = p->pPars->nFramesK;
  uVar11 = pAVar6->nTruePis * iVar5;
  p->pNodeToFrames[pAVar6->pConst1->Id * p->nFrames + iVar5] = p->pFrames->pConst1;
  pAVar6 = p->pAig;
  if (0 < pAVar6->nTruePis) {
    lVar14 = 0;
    do {
      if (pAVar6->vCis->nSize <= lVar14) {
LAB_005e18da:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = pAVar6->vCis->pArray[lVar14];
      pAVar7 = Aig_ObjCreateCi(p->pFrames);
      pVVar3 = p->vInits;
      if (pVVar3 == (Vec_Int_t *)0x0) {
        uVar13 = 0;
      }
      else {
        if (((int)uVar11 < 0) || (pVVar3->nSize <= (int)uVar11)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar13 = (ulong)uVar11;
        uVar11 = uVar11 + 1;
        uVar13 = (ulong)(pVVar3->pArray[uVar13] != 0) << 3;
      }
      *(ulong *)&pAVar7->field_0x18 = *(ulong *)&pAVar7->field_0x18 & 0xfffffffffffffff7 | uVar13;
      p->pNodeToFrames[*(int *)((long)pvVar2 + 0x24) * p->nFrames + iVar5] = pAVar7;
      lVar14 = lVar14 + 1;
      pAVar6 = p->pAig;
    } while (lVar14 < pAVar6->nTruePis);
  }
  if (p->vInits->nSize != uVar11) {
    __assert_fail("Vec_IntSize(p->vInits) == iLits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswConstr.c"
                  ,0x292,"int Ssw_ManSweepConstr(Ssw_Man_t *)");
  }
  iVar5 = clock_gettime(3,&local_40);
  if (iVar5 < 0) {
    lVar14 = -1;
  }
  else {
    lVar14 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  p->timeReduce = p->timeReduce + lVar14 + lVar9;
  iVar5 = p->pPars->nFramesK;
  if (-1 < iVar5) {
    f = 0;
    do {
      pAVar6 = p->pAig;
      uVar13 = (ulong)(uint)pAVar6->nTruePos;
      if (0 < pAVar6->nTruePos) {
        lVar9 = 0;
        do {
          if (pAVar6->vCos->nSize <= lVar9) goto LAB_005e18da;
          if ((long)(int)uVar13 - (long)pAVar6->nConstrs <= lVar9) {
            pvVar2 = pAVar6->vCos->pArray[lVar9];
            Ssw_FramesWithClasses_rec
                      (p,(Aig_Obj_t *)(*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe),f);
            if (((ulong)pvVar2 & 1) != 0) goto LAB_005e18f9;
            uVar13 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
            uVar11 = (uint)*(ulong *)((long)pvVar2 + 8);
            if (uVar13 == 0) {
              pAVar7 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar7 = (Aig_Obj_t *)
                       ((ulong)(uVar11 & 1) ^
                       (ulong)p->pNodeToFrames[*(int *)(uVar13 + 0x24) * p->nFrames + f]);
            }
            pAVar12 = p->pFrames->pConst1;
            if (pAVar7 != (Aig_Obj_t *)((ulong)pAVar12 ^ 1)) {
              if (uVar13 == 0) {
                pAVar7 = (Aig_Obj_t *)0x0;
              }
              else {
                pAVar7 = (Aig_Obj_t *)
                         ((ulong)(uVar11 & 1) ^
                         (ulong)p->pNodeToFrames[*(int *)(uVar13 + 0x24) * p->nFrames + f]);
              }
              if (pAVar7 == pAVar12) {
                __assert_fail("Ssw_ObjChild0Fra(p,pObj,f) != Aig_ManConst1(p->pFrames)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswConstr.c"
                              ,0x2a0,"int Ssw_ManSweepConstr(Ssw_Man_t *)");
              }
              if (uVar13 == 0) {
                pAVar7 = (Aig_Obj_t *)0x0;
              }
              else {
                pAVar7 = (Aig_Obj_t *)
                         ((ulong)(uVar11 & 1) ^
                         (ulong)p->pNodeToFrames[*(int *)(uVar13 + 0x24) * p->nFrames + f]);
              }
              if (pAVar7 == pAVar12) {
                Abc_Print((int)pAVar7,"Polarity violation.\n");
              }
              else {
                if (uVar13 == 0) {
                  pAVar7 = (Aig_Obj_t *)0x0;
                }
                else {
                  pAVar7 = (Aig_Obj_t *)
                           ((ulong)(uVar11 & 1) ^
                           (ulong)p->pNodeToFrames[*(int *)(uVar13 + 0x24) * p->nFrames + f]);
                }
                Ssw_NodesAreConstrained(p,pAVar7,(Aig_Obj_t *)((ulong)pAVar12 ^ 1));
              }
            }
          }
          lVar9 = lVar9 + 1;
          pAVar6 = p->pAig;
          uVar13 = (ulong)pAVar6->nTruePos;
        } while (lVar9 < (long)uVar13);
      }
      iVar5 = p->pPars->nFramesK;
      bVar4 = f < iVar5;
      f = f + 1;
    } while (bVar4);
  }
  sat_solver_simplify(p->pMSat->pSat);
  p->fRefined = 0;
  Ssw_ClassesClearRefined(p->ppClasses);
  if (p->pPars->fVerbose == 0) {
    p_00 = (Bar_Progress_t *)0x0;
  }
  else {
    p_00 = Bar_ProgressStart(_stdout,p->pAig->vObjs->nSize);
  }
  pVVar8 = p->pAig->vObjs;
  if (0 < pVVar8->nSize) {
    lVar9 = 0;
    do {
      pAVar7 = (Aig_Obj_t *)pVVar8->pArray[lVar9];
      if (pAVar7 != (Aig_Obj_t *)0x0) {
        if ((p->pPars->fVerbose != 0) &&
           ((p_00 == (Bar_Progress_t *)0x0 || (p_00->nItemsNext <= lVar9)))) {
          Bar_ProgressUpdate_int(p_00,(int)lVar9,(char *)0x0);
        }
        uVar11 = (uint)*(undefined8 *)&pAVar7->field_0x18;
        if ((uVar11 & 7) == 2) {
          pAVar6 = p->pAig;
          if ((pAVar7->field_0).CioId < pAVar6->nTruePis) goto LAB_005e1807;
        }
        else {
LAB_005e1807:
          if ((uVar11 & 7) - 7 < 0xfffffffe) goto LAB_005e189f;
          if (((ulong)pAVar7 & 1) != 0) {
LAB_005e18f9:
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswInt.h"
                          ,0xb9,"Aig_Obj_t *Ssw_ObjChild0Fra(Ssw_Man_t *, Aig_Obj_t *, int)");
          }
          uVar13 = (ulong)pAVar7->pFanin0 & 0xfffffffffffffffe;
          if (uVar13 == 0) {
            pAVar12 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar12 = (Aig_Obj_t *)
                      ((ulong)((uint)pAVar7->pFanin0 & 1) ^
                      (ulong)p->pNodeToFrames[*(int *)(uVar13 + 0x24) * p->nFrames + iVar5]);
          }
          uVar13 = (ulong)pAVar7->pFanin1 & 0xfffffffffffffffe;
          if (uVar13 == 0) {
            p1 = (Aig_Obj_t *)0x0;
          }
          else {
            p1 = (Aig_Obj_t *)
                 ((ulong)((uint)pAVar7->pFanin1 & 1) ^
                 (ulong)p->pNodeToFrames[*(int *)(uVar13 + 0x24) * p->nFrames + iVar5]);
          }
          pAVar12 = Aig_And(p->pFrames,pAVar12,p1);
          pAVar6 = (Aig_Man_t *)(long)(pAVar7->Id * p->nFrames + iVar5);
          p->pNodeToFrames[(long)pAVar6] = pAVar12;
        }
        uVar11 = Ssw_ManSweepNodeConstr(p,pAVar7,iVar5,(int)pAVar6);
        p->fRefined = p->fRefined | uVar11;
      }
LAB_005e189f:
      lVar9 = lVar9 + 1;
      pVVar8 = p->pAig->vObjs;
    } while (lVar9 < pVVar8->nSize);
  }
  if (p->pPars->fVerbose != 0) {
    Bar_ProgressStop(p_00);
  }
  return p->fRefined;
}

Assistant:

int Ssw_ManSweepConstr( Ssw_Man_t * p )
{
    Bar_Progress_t * pProgress = NULL;
    Aig_Obj_t * pObj, * pObj2, * pObjNew;
    int nConstrPairs, i, f, iLits;
    abctime clk;
//Ssw_ManPrintPolarity( p->pAig );

    // perform speculative reduction
clk = Abc_Clock();
    // create timeframes
    p->pFrames = Ssw_FramesWithClasses( p );
    // add constants
    nConstrPairs = Aig_ManCoNum(p->pFrames)-Aig_ManRegNum(p->pAig);
    assert( (nConstrPairs & 1) == 0 );
    for ( i = 0; i < nConstrPairs; i += 2 )
    {
        pObj  = Aig_ManCo( p->pFrames, i   );
        pObj2 = Aig_ManCo( p->pFrames, i+1 );
        Ssw_NodesAreConstrained( p, Aig_ObjChild0(pObj), Aig_ObjChild0(pObj2) );
    }
    // build logic cones for register inputs
    for ( i = 0; i < Aig_ManRegNum(p->pAig); i++ )
    {
        pObj  = Aig_ManCo( p->pFrames, nConstrPairs + i );
        Ssw_CnfNodeAddToSolver( p->pMSat, Aig_ObjFanin0(pObj) );//
    }

    // map constants and PIs of the last frame
    f = p->pPars->nFramesK;
//    iLits = 0;
    iLits = f * Saig_ManPiNum(p->pAig);
    Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), f, Aig_ManConst1(p->pFrames) );
    Saig_ManForEachPi( p->pAig, pObj, i )
    {
        pObjNew = Aig_ObjCreateCi(p->pFrames);
        pObjNew->fPhase = (p->vInits != NULL) && Vec_IntEntry(p->vInits, iLits++);
        Ssw_ObjSetFrame( p, pObj, f, pObjNew );
    }
    assert( Vec_IntSize(p->vInits) == iLits );
p->timeReduce += Abc_Clock() - clk;

    // add constraints to all timeframes
    for ( f = 0; f <= p->pPars->nFramesK; f++ )
    {
        Saig_ManForEachPo( p->pAig, pObj, i )
        {
            if ( i < Saig_ManPoNum(p->pAig) - Saig_ManConstrNum(p->pAig) )
                continue;
            Ssw_FramesWithClasses_rec( p, Aig_ObjFanin0(pObj), f );
//            if ( Aig_Regular(Ssw_ObjChild0Fra(p,pObj,f)) == Aig_ManConst1(p->pFrames) )
            if ( Ssw_ObjChild0Fra(p,pObj,f) == Aig_ManConst0(p->pFrames) )
                continue;
            assert( Ssw_ObjChild0Fra(p,pObj,f) != Aig_ManConst1(p->pFrames) );
            if ( Ssw_ObjChild0Fra(p,pObj,f) == Aig_ManConst1(p->pFrames) )
            {
                Abc_Print( 1, "Polarity violation.\n" );
                continue;
            }
            Ssw_NodesAreConstrained( p, Ssw_ObjChild0Fra(p,pObj,f), Aig_ManConst0(p->pFrames) );
        }
    }
    f = p->pPars->nFramesK;
    // clean the solver
    sat_solver_simplify( p->pMSat->pSat );


    // sweep internal nodes
    p->fRefined = 0;
    Ssw_ClassesClearRefined( p->ppClasses );
    if ( p->pPars->fVerbose )
        pProgress = Bar_ProgressStart( stdout, Aig_ManObjNumMax(p->pAig) );
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( p->pPars->fVerbose )
            Bar_ProgressUpdate( pProgress, i, NULL );
        if ( Saig_ObjIsLo(p->pAig, pObj) )
            p->fRefined |= Ssw_ManSweepNodeConstr( p, pObj, f, 0 );
        else if ( Aig_ObjIsNode(pObj) )
        {
            pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
            p->fRefined |= Ssw_ManSweepNodeConstr( p, pObj, f, 0 );
        }
    }
    if ( p->pPars->fVerbose )
        Bar_ProgressStop( pProgress );
    // cleanup
//    Ssw_ClassesCheck( p->ppClasses );
    return p->fRefined;
}